

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void charls::string_copy(char *source,char *destination,size_t size_in_bytes)

{
  size_t sVar1;
  size_t size_in_bytes_local;
  char *destination_local;
  char *source_local;
  
  sVar1 = strlen(source);
  if (size_in_bytes <= sVar1) {
    __assert_fail("strlen(source) < size_in_bytes && \"String will be truncated\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/util.h"
                  ,0x85,"void charls::string_copy(const char *, char *, const size_t)");
  }
  strncpy(destination,source,size_in_bytes);
  destination[size_in_bytes - 1] = '\0';
  return;
}

Assistant:

inline void string_copy(CHARLS_IN_Z const char* source, CHARLS_OUT_WRITES_Z(size_in_bytes) char* destination,
                        const size_t size_in_bytes) noexcept
{
    ASSERT(strlen(source) < size_in_bytes && "String will be truncated");

#if defined(__STDC_SECURE_LIB__) && defined(__STDC_WANT_SECURE_LIB__) && __STDC_WANT_SECURE_LIB__ == 1
    constexpr size_t truncate{static_cast<size_t>(-1)};
    strncpy_s(destination, size_in_bytes, source, truncate);
#else
    strncpy(destination, source, size_in_bytes);
    destination[size_in_bytes - 1] = 0;
#endif
}